

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

string * currentDateTime_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  char buf [80];
  tm tstruct;
  time_t now;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  tm local_48;
  time_t local_10 [2];
  
  local_10[0] = time((time_t *)0x0);
  ptVar1 = localtime(local_10);
  local_48.tm_zone = ptVar1->tm_zone;
  local_48.tm_sec = ptVar1->tm_sec;
  local_48.tm_min = ptVar1->tm_min;
  local_48.tm_hour = ptVar1->tm_hour;
  local_48.tm_mday = ptVar1->tm_mday;
  local_48.tm_mon = ptVar1->tm_mon;
  local_48.tm_year = ptVar1->tm_year;
  local_48.tm_wday = ptVar1->tm_wday;
  local_48.tm_yday = ptVar1->tm_yday;
  local_48.tm_isdst = ptVar1->tm_isdst;
  local_48._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_48.tm_gmtoff = ptVar1->tm_gmtoff;
  strftime(&stack0xffffffffffffff68,0x50,"%Y-%m-%d.%X",&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  return in_RDI;
}

Assistant:

string currentDateTime() {
    time_t     now = time(0);
    struct tm  tstruct;
    char       buf[80];
    tstruct = *localtime(&now);
    strftime(buf, sizeof(buf), "%Y-%m-%d.%X", &tstruct);
    return buf;
}